

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::SampledImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  undefined1 *this;
  VkFormat format;
  VkImage image;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkRenderPass renderPass_00;
  VkShaderModule vertexModule_00;
  VkShaderModule fragmentModule_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data_03;
  RefData<vk::Handle<(vk::HandleType)24>_> data_04;
  RefData<vk::VkCommandBuffer_s_*> data_05;
  RefData<vk::Handle<(vk::HandleType)13>_> data_06;
  RefData<vk::Handle<(vk::HandleType)20>_> data_07;
  RefData<vk::Handle<(vk::HandleType)9>_> data_08;
  RefData<vk::Handle<(vk::HandleType)13>_> data_09;
  RefData<vk::Handle<(vk::HandleType)8>_> data_10;
  RefData<vk::Handle<(vk::HandleType)8>_> data_11;
  RefData<vk::Handle<(vk::HandleType)19>_> data_12;
  RefData<vk::Handle<(vk::HandleType)21>_> data_13;
  RefData<vk::Handle<(vk::HandleType)22>_> data_14;
  RefData<vk::Handle<(vk::HandleType)14>_> data_15;
  RefData<vk::Handle<(vk::HandleType)14>_> data_16;
  RefData<vk::Handle<(vk::HandleType)17>_> data_17;
  RefData<vk::Handle<(vk::HandleType)23>_> data_18;
  RefData<vk::Handle<(vk::HandleType)16>_> data_19;
  VkImageViewType viewType;
  Allocator *pAVar3;
  VkQueue queue_00;
  VkPhysicalDevice pVVar4;
  InstanceInterface *pIVar5;
  CaseDef *context_00;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  VkResult result;
  TestContext *this_00;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  Handle<(vk::HandleType)9> *pHVar13;
  Handle<(vk::HandleType)24> *pHVar14;
  VkOffset2D VVar15;
  VkExtent2D VVar16;
  VkDeviceSize bufferSize;
  Handle<(vk::HandleType)8> *pHVar17;
  Allocation *pAVar18;
  void *pvVar19;
  const_reference src;
  VkDeviceSize offset;
  Handle<(vk::HandleType)20> *immutableSampler;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  Handle<(vk::HandleType)21> *pHVar20;
  Handle<(vk::HandleType)19> *pHVar21;
  Handle<(vk::HandleType)13> *pHVar22;
  Handle<(vk::HandleType)22> *pHVar23;
  DescriptorSetUpdateBuilder *this_03;
  ProgramCollection<vk::ProgramBinary> *pPVar24;
  ProgramBinary *pPVar25;
  Handle<(vk::HandleType)17> *pHVar26;
  Handle<(vk::HandleType)16> *pHVar27;
  Handle<(vk::HandleType)14> *pHVar28;
  VkCommandBuffer_s **ppVVar29;
  Handle<(vk::HandleType)23> *pHVar30;
  const_reference this_04;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_05;
  Handle<(vk::HandleType)18> *pHVar31;
  size_type sVar32;
  int *piVar33;
  MovePtr *pMVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  allocator<char> local_fd9;
  string local_fd8;
  int local_fb8;
  allocator<char> local_fb1;
  string local_fb0;
  undefined1 local_f8c [24];
  int x;
  int y;
  int numExpectedChecksum;
  undefined1 local_f68 [8];
  ConstPixelBufferAccess access;
  undefined4 local_f38 [2];
  VkBufferMemoryBarrier barriers_2 [1];
  undefined8 local_ed0;
  VkBufferImageCopy region;
  VkImageMemoryBarrier barriers_1 [1];
  VkDeviceSize vertexBufferOffset;
  undefined4 local_e38 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue clearValue;
  VkImageMemoryBarrier barriers [1];
  undefined1 local_d78 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  Move<vk::Handle<(vk::HandleType)16>_> local_d58;
  RefData<vk::Handle<(vk::HandleType)16>_> local_d38;
  undefined1 local_d18 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_cf0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_cd0;
  undefined1 local_cb0 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_c70;
  undefined1 local_c50 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  string local_c28;
  Move<vk::Handle<(vk::HandleType)14>_> local_c08;
  RefData<vk::Handle<(vk::HandleType)14>_> local_be8;
  undefined1 local_bc8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_ba0;
  Move<vk::Handle<(vk::HandleType)14>_> local_b80;
  RefData<vk::Handle<(vk::HandleType)14>_> local_b60;
  undefined1 local_b40 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  DescriptorSetUpdateBuilder local_b10;
  deUint64 local_ac8;
  VkSampler local_ac0;
  undefined1 local_ab8 [8];
  VkDescriptorImageInfo imageDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_a90;
  RefData<vk::Handle<(vk::HandleType)22>_> local_a70;
  undefined1 local_a50 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_a18;
  RefData<vk::Handle<(vk::HandleType)21>_> local_9f8;
  undefined1 local_9d8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_970;
  RefData<vk::Handle<(vk::HandleType)19>_> local_950;
  undefined1 local_930 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_8f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_8e8;
  undefined1 local_8d8 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_8a8;
  undefined1 local_888 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  VkDeviceSize vertexBufferSize;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_838;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_828;
  undefined1 local_818 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> checksumBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_7e8;
  undefined1 local_7c8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> checksumBuffer;
  VkDeviceSize checksumBufferSize;
  undefined8 uStack_790;
  deUint32 local_788;
  VkImage local_780;
  Move<vk::Handle<(vk::HandleType)13>_> local_778;
  RefData<vk::Handle<(vk::HandleType)13>_> local_758;
  undefined1 local_738 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> checksumImageView;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_708;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_6f8;
  undefined1 local_6e8 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> checksumImageAlloc;
  RefData<vk::Handle<(vk::HandleType)9>_> local_6b8;
  undefined1 local_698 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> checksumImage;
  undefined1 local_670 [4];
  VkFormat checksumFormat;
  RefData<vk::Handle<(vk::HandleType)20>_> local_650;
  undefined1 local_630 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> colorSampler;
  undefined8 uStack_608;
  deUint32 local_600;
  Move<vk::Handle<(vk::HandleType)13>_> local_5f0;
  RefData<vk::Handle<(vk::HandleType)13>_> local_5d0;
  undefined1 local_5b0 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorImageView;
  VkImageViewType colorImageViewType;
  VkRect2D renderArea;
  Move<vk::VkCommandBuffer_s_*> local_568;
  RefData<vk::VkCommandBuffer_s_*> local_548;
  undefined1 local_528 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4e8;
  undefined1 local_4c8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_498;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_488;
  undefined1 local_478 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  RefData<vk::Handle<(vk::HandleType)9>_> local_448;
  undefined1 local_428 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> colorImage;
  string local_400;
  allocator<char> local_3c9;
  string local_3c8;
  LogSection local_3a8;
  MessageBuilder local_368;
  MessageBuilder local_1e8;
  TestLog *local_68;
  TestLog *log;
  Allocator *pAStack_58;
  VkImageUsageFlags colorImageUsage;
  Allocator *allocator;
  VkQueue pVStack_48;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  CaseDef *caseDef_local;
  Context *context_local;
  
  vk = (DeviceInterface *)caseDef;
  caseDef_local = (CaseDef *)context;
  context_local = (Context *)__return_storage_ptr__;
  vki = (InstanceInterface *)Context::getDeviceInterface(context);
  device = (VkDevice)Context::getInstanceInterface((Context *)caseDef_local);
  physDevice = (VkPhysicalDevice)Context::getDevice((Context *)caseDef_local);
  queue = (VkQueue)Context::getPhysicalDevice((Context *)caseDef_local);
  pVStack_48 = Context::getUniversalQueue((Context *)caseDef_local);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex((Context *)caseDef_local);
  pAStack_58 = Context::getDefaultAllocator((Context *)caseDef_local);
  log._4_4_ = 0x14;
  checkImageFormatRequirements
            ((InstanceInterface *)device,(VkPhysicalDevice)queue,caseDef->numSamples,
             caseDef->colorFormat,0x14);
  this_00 = Context::getTestContext((Context *)caseDef_local);
  pTVar11 = tcu::TestContext::getLog(this_00);
  local_68 = pTVar11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Description",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"",
             (allocator<char> *)
             ((long)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                     m_allocator + 7));
  tcu::LogSection::LogSection(&local_3a8,&local_3c8,&local_400);
  pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_3a8);
  tcu::TestLog::operator<<(&local_368,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (&local_368,
                       (char (*) [106])
                       "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color."
                      );
  pTVar11 = tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_1e8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (&local_1e8,
                       (char (*) [58])"Sampling from the texture with texelFetch (OpImageFetch).");
  pTVar11 = tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(pTVar11,(EndSectionToken *)&tcu::TestLog::EndSection);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  tcu::MessageBuilder::~MessageBuilder(&local_368);
  tcu::LogSection::~LogSection(&local_3a8);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                     m_allocator + 7));
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  this = &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.field_0x8;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)this,(DeviceInterface *)vki,(VkDevice)physDevice
            ,caseDef->colorFormat,&caseDef->renderSize,caseDef->numLayers,caseDef->numSamples,0x14);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_448,(Move *)this);
  uVar35 = (undefined4)local_448.object.m_internal;
  uVar36 = (undefined4)(local_448.object.m_internal >> 0x20);
  uVar37 = SUB84(local_448.deleter.m_deviceIface,0);
  uVar38 = (undefined4)((ulong)local_448.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_deviceIface._0_4_ = uVar37;
  data_03.object.m_internal = local_448.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = uVar38;
  data_03.deleter.m_device._0_4_ = (int)local_448.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_448.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_448.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_448.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_428,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  pMVar34 = (MovePtr *)vki;
  pVVar4 = physDevice;
  pAVar3 = pAStack_58;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_428);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::Any.m_flags;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_498,
            (DeviceInterface *)pMVar34,(VkDevice)pVVar4,pAVar3,(VkImage)pHVar13->m_internal,
            ::vk::MemoryRequirement::Any);
  local_488 = de::details::MovePtr::operator_cast_to_PtrData(&local_498,pMVar34);
  data.ptr._4_4_ = uVar36;
  data.ptr._0_4_ = uVar35;
  data._8_4_ = uVar37;
  data._12_4_ = uVar38;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_478,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_498);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (DeviceInterface *)vki,(VkDevice)physDevice,2,allocator._4_4_,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4e8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_4e8.deleter.m_deviceIface;
  data_04.object.m_internal = local_4e8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4e8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_4e8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_4e8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_4e8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_4e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4c8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4c8);
  makeCommandBuffer(&local_568,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,
                    (VkCommandPool)pHVar14->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_548,(Move *)&local_568);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_548.deleter.m_deviceIface;
  data_05.object = local_548.object;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_548.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_548.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_548.deleter.m_device >> 0x20);
  data_05.deleter.m_pool.m_internal._0_4_ = (int)local_548.deleter.m_pool.m_internal;
  data_05.deleter.m_pool.m_internal._4_4_ = (int)(local_548.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_528,data_05);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_568);
  VVar15 = ::vk::makeOffset2D(0,0);
  dVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  dVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  VVar16 = ::vk::makeExtent2D(dVar6,dVar7);
  context_00 = caseDef_local;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_428);
  renderMultisampledImage((Context *)context_00,caseDef,(VkImage)pHVar13->m_internal);
  pIVar5 = vki;
  pVVar4 = physDevice;
  colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_ =
       (uint)(caseDef->numLayers != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_428);
  viewType = colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
             m_allocator._4_4_;
  image.m_internal = pHVar13->m_internal;
  format = caseDef->colorFormat;
  makeColorSubresourceRange
            ((VkImageSubresourceRange *)
             &colorSampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
             ,0,caseDef->numLayers);
  subresourceRange.levelCount = (int)uStack_608;
  subresourceRange._0_8_ =
       colorSampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  subresourceRange.baseArrayLayer = (int)((ulong)uStack_608 >> 0x20);
  subresourceRange.layerCount = local_600;
  makeImageView(&local_5f0,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,image,viewType,format,
                subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5d0,(Move *)&local_5f0);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_5d0.deleter.m_deviceIface;
  data_06.object.m_internal = local_5d0.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5d0.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_5d0.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_5d0.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_5d0.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_5d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_5b0,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_5f0);
  makeSampler((Move<vk::Handle<(vk::HandleType)20>_> *)local_670,(DeviceInterface *)vki,
              (VkDevice)physDevice);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_650,(Move *)local_670);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_650.deleter.m_deviceIface;
  data_07.object.m_internal = local_650.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_650.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_650.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_650.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_650.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_650.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_630,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)local_670);
  checksumImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._4_4_ = 99;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)
            &checksumImageAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8,
            (DeviceInterface *)vki,(VkDevice)physDevice,VK_FORMAT_R32_SINT,&caseDef->renderSize,1,
            VK_SAMPLE_COUNT_1_BIT,0x11);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_6b8,
             (Move *)&checksumImageAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar35 = (undefined4)local_6b8.object.m_internal;
  uVar36 = (undefined4)(local_6b8.object.m_internal >> 0x20);
  uVar37 = SUB84(local_6b8.deleter.m_deviceIface,0);
  uVar38 = (undefined4)((ulong)local_6b8.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_deviceIface._0_4_ = uVar37;
  data_08.object.m_internal = local_6b8.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = uVar38;
  data_08.deleter.m_device._0_4_ = (int)local_6b8.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_6b8.deleter.m_device >> 0x20);
  data_08.deleter.m_allocator._0_4_ = (int)local_6b8.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_6b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_698,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &checksumImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pMVar34 = (MovePtr *)vki;
  pVVar4 = physDevice;
  pAVar3 = pAStack_58;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_698);
  checksumImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_
       = ::vk::MemoryRequirement::Any.m_flags;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_708,
            (DeviceInterface *)pMVar34,(VkDevice)pVVar4,pAVar3,(VkImage)pHVar13->m_internal,
            ::vk::MemoryRequirement::Any);
  local_6f8 = de::details::MovePtr::operator_cast_to_PtrData(&local_708,pMVar34);
  data_00.ptr._4_4_ = uVar36;
  data_00.ptr._0_4_ = uVar35;
  data_00._8_4_ = uVar37;
  data_00._12_4_ = uVar38;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_6e8,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_708);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_698);
  local_780.m_internal = pHVar13->m_internal;
  makeColorSubresourceRange((VkImageSubresourceRange *)&checksumBufferSize,0,1);
  subresourceRange_00.levelCount = (deUint32)uStack_790;
  subresourceRange_00.aspectMask = (undefined4)checksumBufferSize;
  subresourceRange_00.baseMipLevel = checksumBufferSize._4_4_;
  subresourceRange_00.baseArrayLayer = SUB84(uStack_790,4);
  subresourceRange_00.layerCount = local_788;
  makeImageView(&local_778,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,local_780,
                VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_SINT,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_758,(Move *)&local_778);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_758.deleter.m_deviceIface;
  data_09.object.m_internal = local_758.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_758.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device._0_4_ = (int)local_758.deleter.m_device;
  data_09.deleter.m_device._4_4_ = (int)((ulong)local_758.deleter.m_device >> 0x20);
  data_09.deleter.m_allocator._0_4_ = (int)local_758.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_758.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_738,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_778);
  iVar8 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  iVar9 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  checksumBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  iVar10 = tcu::getPixelSize((TextureFormat)
                             checksumBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  bufferSize = (VkDeviceSize)(iVar8 * iVar9 * iVar10);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &checksumBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,(DeviceInterface *)vki,(VkDevice)physDevice,bufferSize,2);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_7e8,
             (Move *)&checksumBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar35 = (undefined4)local_7e8.object.m_internal;
  uVar36 = (undefined4)(local_7e8.object.m_internal >> 0x20);
  uVar37 = SUB84(local_7e8.deleter.m_deviceIface,0);
  uVar38 = (undefined4)((ulong)local_7e8.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_deviceIface._0_4_ = uVar37;
  data_10.object.m_internal = local_7e8.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = uVar38;
  data_10.deleter.m_device._0_4_ = (int)local_7e8.deleter.m_device;
  data_10.deleter.m_device._4_4_ = (int)((ulong)local_7e8.deleter.m_device >> 0x20);
  data_10.deleter.m_allocator._0_4_ = (int)local_7e8.deleter.m_allocator;
  data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_7e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_7c8,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &checksumBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pMVar34 = (MovePtr *)vki;
  pVVar4 = physDevice;
  pAVar3 = pAStack_58;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_7c8);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       ::vk::MemoryRequirement::HostVisible.m_flags;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_838,
             (DeviceInterface *)pMVar34,(VkDevice)pVVar4,pAVar3,(VkBuffer)pHVar17->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_828 = de::details::MovePtr::operator_cast_to_PtrData(&local_838,pMVar34);
  data_01.ptr._4_4_ = uVar36;
  data_01.ptr._0_4_ = uVar35;
  data_01._8_4_ = uVar37;
  data_01._12_4_ = uVar38;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_818,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_838);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_818)
  ;
  zeroBuffer((DeviceInterface *)pIVar5,(VkDevice)pVVar4,pAVar18,bufferSize);
  genFullQuadVertices();
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       sizeInBytes<vkt::pipeline::Vertex4RGBA>
                 ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )&vertexBufferSize);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,(DeviceInterface *)vki,(VkDevice)physDevice,
             (VkDeviceSize)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
             0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_8a8,
             (Move *)&vertexBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar35 = (undefined4)local_8a8.object.m_internal;
  uVar36 = (undefined4)(local_8a8.object.m_internal >> 0x20);
  uVar37 = SUB84(local_8a8.deleter.m_deviceIface,0);
  uVar38 = (undefined4)((ulong)local_8a8.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_deviceIface._0_4_ = uVar37;
  data_11.object.m_internal = local_8a8.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = uVar38;
  data_11.deleter.m_device._0_4_ = (int)local_8a8.deleter.m_device;
  data_11.deleter.m_device._4_4_ = (int)((ulong)local_8a8.deleter.m_device >> 0x20);
  data_11.deleter.m_allocator._0_4_ = (int)local_8a8.deleter.m_allocator;
  data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_8a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_888,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pMVar34 = (MovePtr *)vki;
  pVVar4 = physDevice;
  pAVar3 = pAStack_58;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_888);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8f8,
             (DeviceInterface *)pMVar34,(VkDevice)pVVar4,pAVar3,(VkBuffer)pHVar17->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_8e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_8f8,pMVar34);
  data_02.ptr._4_4_ = uVar36;
  data_02.ptr._0_4_ = uVar35;
  data_02._8_4_ = uVar37;
  data_02._12_4_ = uVar38;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d8,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8f8);
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d8)
  ;
  pvVar19 = ::vk::Allocation::getHostPtr(pAVar18);
  src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)&vertexBufferSize,0);
  ::deMemcpy(pvVar19,src,
             (size_t)vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_allocator);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d8)
  ;
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar18);
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d8)
  ;
  offset = ::vk::Allocation::getOffset(pAVar18);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pIVar5,(VkDevice)pVVar4,
             (VkDeviceMemory)
             descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
             m_allocator,offset,
             (VkDeviceSize)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  immutableSampler =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)20>_> *)local_630);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,0x10,immutableSampler
                      );
  ::vk::DescriptorSetLayoutBuilder::build
            (&local_970,this_01,(DeviceInterface *)vki,(VkDevice)physDevice,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_950,(Move *)&local_970);
  data_12.deleter.m_deviceIface._0_4_ = (int)local_950.deleter.m_deviceIface;
  data_12.object.m_internal = local_950.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_950.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_device._0_4_ = (int)local_950.deleter.m_device;
  data_12.deleter.m_device._4_4_ = (int)((ulong)local_950.deleter.m_device >> 0x20);
  data_12.deleter.m_allocator._0_4_ = (int)local_950.deleter.m_allocator;
  data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_950.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_930,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_970);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  ::vk::DescriptorPoolBuilder::build
            (&local_a18,this_02,(DeviceInterface *)vki,(VkDevice)physDevice,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_9f8,(Move *)&local_a18);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_9f8.deleter.m_deviceIface;
  data_13.object.m_internal = local_9f8.object.m_internal;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_9f8.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device._0_4_ = (int)local_9f8.deleter.m_device;
  data_13.deleter.m_device._4_4_ = (int)((ulong)local_9f8.deleter.m_device >> 0x20);
  data_13.deleter.m_allocator._0_4_ = (int)local_9f8.deleter.m_allocator;
  data_13.deleter.m_allocator._4_4_ = (int)((ulong)local_9f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_9d8,data_13);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_a18);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_9d8);
  descriptorPool_00.m_internal = pHVar20->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_930);
  imageDescriptorInfo._16_8_ = pHVar21->m_internal;
  makeDescriptorSet(&local_a90,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,descriptorPool_00,
                    (VkDescriptorSetLayout)imageDescriptorInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a70,(Move *)&local_a90);
  data_14.deleter.m_deviceIface._0_4_ = (int)local_a70.deleter.m_deviceIface;
  data_14.object.m_internal = local_a70.object.m_internal;
  data_14.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a70.deleter.m_deviceIface >> 0x20);
  data_14.deleter.m_device._0_4_ = (int)local_a70.deleter.m_device;
  data_14.deleter.m_device._4_4_ = (int)((ulong)local_a70.deleter.m_device >> 0x20);
  data_14.deleter.m_pool.m_internal._0_4_ = (int)local_a70.deleter.m_pool.m_internal;
  data_14.deleter.m_pool.m_internal._4_4_ = (int)(local_a70.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_a50,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_a90);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_ac0,0);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_5b0);
  local_ac8 = pHVar22->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_ab8,local_ac0,(VkImageView)local_ac8,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_b10);
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_a50);
  destSet.m_internal = pHVar23->m_internal;
  vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_b10,destSet,
                       (Location *)
                       &vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                       (VkDescriptorImageInfo *)local_ab8);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,(DeviceInterface *)vki,(VkDevice)physDevice);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_b10);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pPVar24 = Context::getBinaryCollection((Context *)caseDef_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba0,"sample_vert",
             (allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar25 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar24,&local_ba0);
  ::vk::createShaderModule(&local_b80,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,pPVar25,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b60,(Move *)&local_b80);
  data_15.deleter.m_deviceIface._0_4_ = (int)local_b60.deleter.m_deviceIface;
  data_15.object.m_internal = local_b60.object.m_internal;
  data_15.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b60.deleter.m_deviceIface >> 0x20);
  data_15.deleter.m_device._0_4_ = (int)local_b60.deleter.m_device;
  data_15.deleter.m_device._4_4_ = (int)((ulong)local_b60.deleter.m_device >> 0x20);
  data_15.deleter.m_allocator._0_4_ = (int)local_b60.deleter.m_allocator;
  data_15.deleter.m_allocator._4_4_ = (int)((ulong)local_b60.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_b40,data_15);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_b80);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pIVar5 = vki;
  pVVar4 = physDevice;
  pPVar24 = Context::getBinaryCollection((Context *)caseDef_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,"sample_frag",
             (allocator<char> *)
             ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar25 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar24,&local_c28);
  ::vk::createShaderModule(&local_c08,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,pPVar25,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_be8,(Move *)&local_c08);
  data_16.deleter.m_deviceIface._0_4_ = (int)local_be8.deleter.m_deviceIface;
  data_16.object.m_internal = local_be8.object.m_internal;
  data_16.deleter.m_deviceIface._4_4_ = (int)((ulong)local_be8.deleter.m_deviceIface >> 0x20);
  data_16.deleter.m_device._0_4_ = (int)local_be8.deleter.m_device;
  data_16.deleter.m_device._4_4_ = (int)((ulong)local_be8.deleter.m_device >> 0x20);
  data_16.deleter.m_allocator._0_4_ = (int)local_be8.deleter.m_allocator;
  data_16.deleter.m_allocator._4_4_ = (int)((ulong)local_be8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_bc8,data_16);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_c08);
  std::__cxx11::string::~string((string *)&local_c28);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator + 7));
  makeSimpleRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             (DeviceInterface *)vki,(VkDevice)physDevice,VK_FORMAT_R32_SINT);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c70,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_17.deleter.m_deviceIface._0_4_ = (int)local_c70.deleter.m_deviceIface;
  data_17.object.m_internal = local_c70.object.m_internal;
  data_17.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c70.deleter.m_deviceIface >> 0x20);
  data_17.deleter.m_device._0_4_ = (int)local_c70.deleter.m_device;
  data_17.deleter.m_device._4_4_ = (int)((ulong)local_c70.deleter.m_device >> 0x20);
  data_17.deleter.m_allocator._0_4_ = (int)local_c70.deleter.m_allocator;
  data_17.deleter.m_allocator._4_4_ = (int)((ulong)local_c70.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_c50,data_17);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_c50);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar26->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_738);
  dVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  dVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  makeFramebuffer(&local_cf0,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,
                  (VkRenderPass)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,1,pHVar22,dVar6,dVar7,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_cd0,(Move *)&local_cf0);
  data_18.deleter.m_deviceIface._0_4_ = (int)local_cd0.deleter.m_deviceIface;
  data_18.object.m_internal = local_cd0.object.m_internal;
  data_18.deleter.m_deviceIface._4_4_ = (int)((ulong)local_cd0.deleter.m_deviceIface >> 0x20);
  data_18.deleter.m_device._0_4_ = (int)local_cd0.deleter.m_device;
  data_18.deleter.m_device._4_4_ = (int)((ulong)local_cd0.deleter.m_device >> 0x20);
  data_18.deleter.m_allocator._0_4_ = (int)local_cd0.deleter.m_allocator;
  data_18.deleter.m_allocator._4_4_ = (int)((ulong)local_cd0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_cb0,data_18);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_cf0);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_930);
  pipelines.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar21->m_internal;
  makePipelineLayout(&local_d58,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,
                     (VkDescriptorSetLayout)
                     pipelines.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d38,(Move *)&local_d58);
  data_19.deleter.m_deviceIface._0_4_ = (int)local_d38.deleter.m_deviceIface;
  data_19.object.m_internal = local_d38.object.m_internal;
  data_19.deleter.m_deviceIface._4_4_ = (int)((ulong)local_d38.deleter.m_deviceIface >> 0x20);
  data_19.deleter.m_device._0_4_ = (int)local_d38.deleter.m_device;
  data_19.deleter.m_device._4_4_ = (int)((ulong)local_d38.deleter.m_device >> 0x20);
  data_19.deleter.m_allocator._0_4_ = (int)local_d38.deleter.m_allocator;
  data_19.deleter.m_allocator._4_4_ = (int)((ulong)local_d38.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_d18,data_19);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_d58);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_d18);
  pipelineLayout_00.m_internal = pHVar27->m_internal;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_c50);
  renderPass_00.m_internal = pHVar26->m_internal;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_b40);
  vertexModule_00.m_internal = pHVar28->m_internal;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_bc8);
  fragmentModule_00.m_internal = pHVar28->m_internal;
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)&barriers[0].subresourceRange.layerCount,&caseDef->renderSize);
  makeGraphicsPipelines
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              *)local_d78,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,1,pipelineLayout_00,
             renderPass_00,vertexModule_00,fragmentModule_00,
             (IVec2 *)&barriers[0].subresourceRange.layerCount,VK_SAMPLE_COUNT_1_BIT,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  beginCommandBuffer((DeviceInterface *)pIVar5,*ppVVar29);
  clearValue._8_4_ = 0x2d;
  barriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers[0]._4_4_ = 0;
  barriers[0].pNext._0_4_ = 0x100;
  barriers[0].pNext._4_4_ = 0x20;
  barriers[0].srcAccessMask = 2;
  barriers[0].dstAccessMask = 5;
  barriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_428);
  barriers[0]._32_8_ = pHVar13->m_internal;
  makeColorSubresourceRange((VkImageSubresourceRange *)&barriers[0].image,0,caseDef->numLayers);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  (*pIVar5->_vptr_InstanceInterface[0x6d])
            (pIVar5,*ppVVar29,0x400,0x80,0,0,0,0,0,1,(long)&clearValue + 8);
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColorU32(0,0,0,0);
  local_e38[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_c50);
  renderPassBeginInfo.pNext = (void *)pHVar26->m_internal;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_cb0);
  pIVar5 = vki;
  renderPassBeginInfo.renderPass.m_internal = pHVar30->m_internal;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)VVar15;
  renderPassBeginInfo.renderArea.offset = (VkOffset2D)VVar16;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  (*pIVar5->_vptr_InstanceInterface[0x74])(pIVar5,*ppVVar29,local_e38,0);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  pVVar1 = *ppVVar29;
  this_04 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                    *)local_d78);
  this_05 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                       (this_04)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(this_05);
  (*pIVar5->_vptr_InstanceInterface[0x4c])(pIVar5,pVVar1,0,pHVar31->m_internal);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  pVVar1 = *ppVVar29;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_d18);
  dVar2 = pHVar27->m_internal;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_a50);
  (*pIVar5->_vptr_InstanceInterface[0x56])(pIVar5,pVVar1,0,dVar2,0,1,(int)pHVar23,0,0);
  pIVar5 = vki;
  barriers_1[0].subresourceRange.layerCount = 0;
  barriers_1[0]._68_4_ = 0;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  pVVar1 = *ppVVar29;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_888);
  (*pIVar5->_vptr_InstanceInterface[0x58])
            (pIVar5,pVVar1,0,1,pHVar17,&barriers_1[0].subresourceRange.layerCount);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  pVVar1 = *ppVVar29;
  sVar32 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
           size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                &vertexBufferSize);
  (*pIVar5->_vptr_InstanceInterface[0x59])(pIVar5,pVVar1,sVar32 & 0xffffffff,1,0);
  pIVar5 = vki;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  (*pIVar5->_vptr_InstanceInterface[0x76])();
  region.imageExtent.height = 0x2d;
  barriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers_1[0]._4_4_ = 0;
  barriers_1[0].pNext._0_4_ = 0x100;
  barriers_1[0].pNext._4_4_ = 0x800;
  barriers_1[0].srcAccessMask = 2;
  barriers_1[0].dstAccessMask = 6;
  barriers_1[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barriers_1[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_698);
  barriers_1[0]._32_8_ = pHVar13->m_internal;
  makeColorSubresourceRange((VkImageSubresourceRange *)&barriers_1[0].image,0,1);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  (*pIVar5->_vptr_InstanceInterface[0x6d])
            (pIVar5,*ppVVar29,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
  local_ed0 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region._8_16_ = makeColorSubresourceLayers(0,1);
  region._24_12_ = ::vk::makeOffset3D(0,0,0);
  dVar6 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  dVar7 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  region._36_12_ = ::vk::makeExtent3D(dVar6,dVar7,1);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  pVVar1 = *ppVVar29;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_698);
  dVar2 = pHVar13->m_internal;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_7c8);
  barriers_2[0].size = pHVar17->m_internal;
  (*pIVar5->_vptr_InstanceInterface[99])(pIVar5,pVVar1,dVar2,6,barriers_2[0].size,1,(int)&local_ed0)
  ;
  local_f38[0] = 0x2c;
  barriers_2[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers_2[0]._4_4_ = 0;
  barriers_2[0].pNext._0_4_ = 0x1000;
  barriers_2[0].pNext._4_4_ = 0x2000;
  barriers_2[0].srcAccessMask = 0xffffffff;
  barriers_2[0].dstAccessMask = 0xffffffff;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_7c8);
  pIVar5 = vki;
  barriers_2[0]._24_8_ = pHVar17->m_internal;
  barriers_2[0].buffer.m_internal = 0;
  barriers_2[0].offset = bufferSize;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  (*pIVar5->_vptr_InstanceInterface[0x6d])
            (pIVar5,*ppVVar29,0x1000,0x4000,0,0,0,1,(int)local_f38,0,0);
  pIVar5 = vki;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  result = (*pIVar5->_vptr_InstanceInterface[0x4a])(pIVar5,*ppVVar29);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x465);
  pIVar5 = vki;
  pVVar4 = physDevice;
  queue_00 = pVStack_48;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_528);
  submitCommandsAndWait((DeviceInterface *)pIVar5,(VkDevice)pVVar4,queue_00,*ppVVar29);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_818)
  ;
  access.m_data = (void *)::vk::Allocation::getMemory(pAVar18);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pIVar5,(VkDevice)pVVar4,(VkDeviceMemory)access.m_data,0,bufferSize);
  _y = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  iVar8 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  iVar9 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_818)
  ;
  pvVar19 = ::vk::Allocation::getHostPtr(pAVar18);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_f68,(TextureFormat *)&y,iVar8,iVar9,1,pvVar19);
  iVar8 = getNumSamples(caseDef->numSamples);
  x = iVar8 * caseDef->numLayers;
  local_f8c._20_4_ = 0;
  do {
    uVar35 = local_f8c._20_4_;
    iVar8 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
    if (iVar8 <= (int)uVar35) {
      local_fb8 = 0;
LAB_0097595a:
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 *)local_d78);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_d18);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_cb0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_c50);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_bc8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_b40);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_a50);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_9d8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_930);
      de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
                ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_888);
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
                ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                 &vertexBufferSize);
      de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
                ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_818);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_7c8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_738);
      de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
                ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_6e8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_698);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_630);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_5b0);
      if (local_fb8 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd8,"OK",&local_fd9);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_fd8);
        std::__cxx11::string::~string((string *)&local_fd8);
        std::allocator<char>::~allocator(&local_fd9);
        local_fb8 = 1;
      }
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_528);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4c8);
      de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
                ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_478);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_428);
      return __return_storage_ptr__;
    }
    local_f8c._16_4_ = 0;
    while( true ) {
      uVar35 = local_f8c._16_4_;
      iVar8 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
      if (iVar8 <= (int)uVar35) break;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_f8c,(int)local_f68,local_f8c._16_4_,
                 local_f8c._20_4_);
      piVar33 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_f8c);
      if (*piVar33 != x) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fb0,"Some samples have incorrect color",&local_fb1);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_fb0);
        std::__cxx11::string::~string((string *)&local_fb0);
        std::allocator<char>::~allocator(&local_fb1);
        local_fb8 = 1;
        goto LAB_0097595a;
      }
      local_f8c._16_4_ = local_f8c._16_4_ + 1;
    }
    local_f8c._20_4_ = local_f8c._20_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	const VkImageUsageFlags		colorImageUsage		= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT;

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, colorImageUsage);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Sampling from the texture with texelFetch (OpImageFetch)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Multisampled color image
	const Unique<VkImage>			colorImage		(makeImage(vk, device, caseDef.colorFormat, caseDef.renderSize, caseDef.numLayers, caseDef.numSamples, colorImageUsage));
	const UniquePtr<Allocation>		colorImageAlloc	(bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any));

	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	// Step 1: Render to texture
	{
		renderMultisampledImage(context, caseDef, *colorImage);
	}

	// Step 2: Sample texture
	{
		// Color image view
		const VkImageViewType			colorImageViewType	= (caseDef.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
		const Unique<VkImageView>		colorImageView		(makeImageView(vk, device, *colorImage, colorImageViewType, caseDef.colorFormat, makeColorSubresourceRange(0, caseDef.numLayers)));
		const Unique<VkSampler>			colorSampler		(makeSampler(vk, device));

		// Checksum image
		const VkFormat					checksumFormat		= VK_FORMAT_R32_SINT;
		const Unique<VkImage>			checksumImage		(makeImage(vk, device, checksumFormat, caseDef.renderSize, 1u, VK_SAMPLE_COUNT_1_BIT,
																	   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
		const UniquePtr<Allocation>		checksumImageAlloc	(bindImage(vk, device, allocator, *checksumImage, MemoryRequirement::Any));
		const Unique<VkImageView>		checksumImageView	(makeImageView(vk, device, *checksumImage, VK_IMAGE_VIEW_TYPE_2D, checksumFormat, makeColorSubresourceRange(0, 1)));

		// Checksum buffer (for host reading)
		const VkDeviceSize				checksumBufferSize	= caseDef.renderSize.x() * caseDef.renderSize.y() * tcu::getPixelSize(mapVkFormat(checksumFormat));
		const Unique<VkBuffer>			checksumBuffer		(makeBuffer(vk, device, checksumBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
		const UniquePtr<Allocation>		checksumBufferAlloc	(bindBuffer(vk, device, allocator, *checksumBuffer, MemoryRequirement::HostVisible));

		zeroBuffer(vk, device, *checksumBufferAlloc, checksumBufferSize);

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genFullQuadVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Descriptors
		// \note OpImageFetch doesn't use a sampler, but in GLSL texelFetch needs a sampler2D which translates to a combined image sampler in Vulkan.

		const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
			.addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_FRAGMENT_BIT, &colorSampler.get())
			.build(vk, device));

		const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

		const Unique<VkDescriptorSet>	descriptorSet		(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
		const VkDescriptorImageInfo		imageDescriptorInfo	= makeDescriptorImageInfo(DE_NULL, *colorImageView, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageDescriptorInfo)
			.update(vk, device);

		const Unique<VkShaderModule>	vertexModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeSimpleRenderPass	(vk, device, checksumFormat));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer		(vk, device, *renderPass, 1u, &checksumImageView.get(),
																				 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout		(vk, device, *descriptorSetLayout));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines	(vk, device, 1u, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																				 caseDef.renderSize, VK_SAMPLE_COUNT_1_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP));

		beginCommandBuffer(vk, *cmdBuffer);

		// Prepare for sampling in the fragment shader
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_SHADER_READ_BIT,									// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,					// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*colorImage,												// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers),			// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		const VkClearValue clearValue = makeClearValueColorU32(0u, 0u, 0u, 0u);

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType         sType;
			DE_NULL,															// const void*             pNext;
			*renderPass,														// VkRenderPass            renderPass;
			*framebuffer,														// VkFramebuffer           framebuffer;
			renderArea,															// VkRect2D                renderArea;
			1u,																	// uint32_t                clearValueCount;
			&clearValue,														// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines.back());
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*cmdBuffer);

		// Prepare checksum image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*checksumImage,												// VkImage					image;
					makeColorSubresourceRange(0, 1),							// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Checksum image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeColorSubresourceLayers(0, 1),											// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.renderSize.x(), caseDef.renderSize.y(), 1u),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *checksumBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					*checksumBuffer,								// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					checksumBufferSize,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify result

		{
			invalidateMappedMemoryRange(vk, device, checksumBufferAlloc->getMemory(), 0ull, checksumBufferSize);

			const tcu::ConstPixelBufferAccess access(mapVkFormat(checksumFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), 1, checksumBufferAlloc->getHostPtr());
			const int numExpectedChecksum = getNumSamples(caseDef.numSamples) * caseDef.numLayers;

			for (int y = 0; y < caseDef.renderSize.y(); ++y)
			for (int x = 0; x < caseDef.renderSize.x(); ++x)
			{
				if (access.getPixelInt(x, y).x() != numExpectedChecksum)
					return tcu::TestStatus::fail("Some samples have incorrect color");
			}
		}
	}

	return tcu::TestStatus::pass("OK");
}